

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

void duckdb::TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<int>>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  data_t dVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  unsafe_vector<idx_t> *puVar4;
  sel_t *psVar5;
  pointer puVar6;
  data_ptr_t pdVar7;
  unsigned_long *puVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong in_stack_00000008;
  ulong in_stack_00000010;
  ulong in_stack_00000018;
  char in_stack_00000020;
  
  if (in_stack_00000008 < in_stack_00000010) {
    pdVar3 = (vector_data->format).data;
    puVar4 = info->offsets;
    do {
      uVar10 = in_stack_00000008;
      if (in_stack_00000020 != '\0') {
        uVar10 = in_stack_00000018;
      }
      psVar5 = ((vector_data->format).sel)->sel_vector;
      uVar11 = in_stack_00000008;
      if (psVar5 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar5[in_stack_00000008];
      }
      puVar6 = (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = info->result_data[uVar10];
      puVar8 = (vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar8 == (unsigned_long *)0x0) || ((puVar8[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)) {
        dVar1 = vector_data->valid_byte;
        uVar9 = puVar6[uVar10];
        puVar6[uVar10] = uVar9 + 1;
        pdVar7[uVar9] = dVar1;
        uVar9 = puVar6[uVar10];
        uVar2 = *(uint *)(pdVar3 + uVar11 * 4);
        *(uint *)(pdVar7 + uVar9) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        pdVar7[uVar9] = (char)(uVar2 >> 0x18) + 0x80;
        if ((info->flip_bytes == true) && (uVar11 = puVar6[uVar10], uVar11 < 0xfffffffffffffffc)) {
          do {
            pdVar7[uVar11] = ~pdVar7[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar11 < puVar6[uVar10] + 4);
        }
        puVar6[uVar10] = puVar6[uVar10] + 4;
      }
      else {
        dVar1 = vector_data->null_byte;
        uVar9 = puVar6[uVar10];
        puVar6[uVar10] = uVar9 + 1;
        pdVar7[uVar9] = dVar1;
      }
      in_stack_00000008 = in_stack_00000008 + 1;
    } while (in_stack_00000008 != in_stack_00000010);
  }
  return;
}

Assistant:

void TemplatedConstructSortKey(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
			continue;
		}
		// valid value - write the validity byte
		result_ptr[offset++] = vector_data.valid_byte;
		idx_t encode_len = OP::Encode(result_ptr + offset, data[idx]);
		if (info.flip_bytes) {
			// descending order - so flip bytes
			for (idx_t b = offset; b < offset + encode_len; b++) {
				result_ptr[b] = ~result_ptr[b];
			}
		}
		offset += encode_len;
	}
}